

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int uv__accept(int sockfd)

{
  int fd;
  int iVar1;
  int *piVar2;
  
  if (sockfd < 0) {
    __assert_fail("sockfd >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/core.c"
                  ,0x1d4,"int uv__accept(int)");
  }
  while (fd = accept(sockfd,(sockaddr *)0x0,(socklen_t *)0x0), fd == -1) {
    piVar2 = __errno_location();
    if (*piVar2 != 4) {
      return -*piVar2;
    }
  }
  iVar1 = uv__cloexec_ioctl(fd,1);
  if (iVar1 == 0) {
    iVar1 = uv__nonblock_ioctl(fd,1);
  }
  if (iVar1 == 0) {
    return fd;
  }
  uv__close(fd);
  return iVar1;
}

Assistant:

int uv__accept(int sockfd) {
  int peerfd;
  int err;

  (void) &err;
  assert(sockfd >= 0);

  do
#ifdef uv__accept4
    peerfd = uv__accept4(sockfd, NULL, NULL, SOCK_NONBLOCK|SOCK_CLOEXEC);
#else
    peerfd = accept(sockfd, NULL, NULL);
#endif
  while (peerfd == -1 && errno == EINTR);

  if (peerfd == -1)
    return UV__ERR(errno);

#ifndef uv__accept4
  err = uv__cloexec(peerfd, 1);
  if (err == 0)
    err = uv__nonblock(peerfd, 1);

  if (err != 0) {
    uv__close(peerfd);
    return err;
  }
#endif

  return peerfd;
}